

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_statfs(void)

{
  long *plVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *req_00;
  uv_loop_t *puVar3;
  uv_fs_t req;
  
  puVar3 = (uv_loop_t *)&stack0xfffffffffffffe48;
  loop = uv_default_loop();
  req_00 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe48,".",(uv_fs_cb)0x0);
  if (iVar2 == 0) {
    statfs_cb((uv_fs_t *)&stack0xfffffffffffffe48);
    req_00 = puVar3;
    if (statfs_cb_count != 1) goto LAB_00157819;
    req_00 = loop;
    iVar2 = uv_fs_statfs(loop,(uv_fs_t *)&stack0xfffffffffffffe48,".",statfs_cb);
    if (iVar2 != 0) goto LAB_0015781e;
    req_00 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (statfs_cb_count == 2) {
      return 0;
    }
  }
  else {
    run_test_fs_statfs_cold_1();
LAB_00157819:
    run_test_fs_statfs_cold_2();
LAB_0015781e:
    run_test_fs_statfs_cold_3();
  }
  run_test_fs_statfs_cold_4();
  if (req_00->backend_fd == 0x22) {
    puVar3 = req_00;
    if (req_00->watcher_queue[0] != (void *)0x0) goto LAB_0015788d;
    plVar1 = (long *)req_00->watcher_queue[1];
    if (plVar1 == (long *)0x0) goto LAB_00157892;
    if (*plVar1 == 0) goto LAB_00157897;
    if (plVar1[1] == 0) goto LAB_0015789c;
    if (plVar1[2] == 0) goto LAB_001578a1;
    if ((ulong)plVar1[2] < (ulong)plVar1[3]) goto LAB_001578a6;
    if ((ulong)plVar1[3] < (ulong)plVar1[4]) goto LAB_001578ab;
    if ((ulong)plVar1[6] <= (ulong)plVar1[5]) {
      uv_fs_req_cleanup((uv_fs_t *)req_00);
      if (req_00->watcher_queue[1] == (void *)0x0) {
        statfs_cb_count = statfs_cb_count + 1;
        return extraout_EAX;
      }
      goto LAB_001578b5;
    }
  }
  else {
    statfs_cb_cold_1();
    puVar3 = req_00;
LAB_0015788d:
    statfs_cb_cold_2();
LAB_00157892:
    statfs_cb_cold_10();
LAB_00157897:
    statfs_cb_cold_9();
LAB_0015789c:
    statfs_cb_cold_8();
LAB_001578a1:
    statfs_cb_cold_7();
LAB_001578a6:
    statfs_cb_cold_6();
LAB_001578ab:
    statfs_cb_cold_5();
  }
  statfs_cb_cold_4();
LAB_001578b5:
  statfs_cb_cold_3();
  iVar2 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fs_statfs) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Test the synchronous version. */
  r = uv_fs_statfs(NULL, &req, ".", NULL);
  ASSERT(r == 0);
  statfs_cb(&req);
  ASSERT(statfs_cb_count == 1);

  /* Test the asynchronous version. */
  r = uv_fs_statfs(loop, &req, ".", statfs_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(statfs_cb_count == 2);

  return 0;
}